

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void QCachedPainter::cleanupPixmapCache(void)

{
  ulong uVar1;
  Hash HVar2;
  ulong uVar3;
  
  if (s_pixmapCacheKeys.q_hash.d == (Data *)0x0) {
    uVar3 = 0;
    HVar2.d = (Data *)0x0;
LAB_00349e48:
    if (HVar2.d == (Data *)0x0 && uVar3 == 0) goto LAB_00349ec4;
  }
  else {
    if (1 < *(uint *)s_pixmapCacheKeys.q_hash.d) {
      s_pixmapCacheKeys.q_hash.d =
           (Hash)QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::detached
                           ((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)
                            s_pixmapCacheKeys.q_hash.d);
    }
    HVar2 = s_pixmapCacheKeys.q_hash.d;
    if (**(char **)((long)s_pixmapCacheKeys.q_hash.d + 0x20) == -1) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (*(ulong *)((long)s_pixmapCacheKeys.q_hash.d + 0x10) == uVar3) {
          HVar2.d = (Data *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while ((*(char **)((long)s_pixmapCacheKeys.q_hash.d + 0x20))
               [(ulong)((uint)uVar3 & 0x7f) + (uVar3 >> 7) * 0x90] == -1);
      goto LAB_00349e48;
    }
    uVar3 = 0;
  }
  do {
    QPixmapCache::remove
              ((QString *)
               ((((HVar2.d)->spans[uVar3 >> 7].entries)->storage).data +
               (uint)(HVar2.d)->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] * 0x18));
    do {
      if ((HVar2.d)->numBuckets - 1 == uVar3) {
        HVar2.d = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while ((HVar2.d)->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while ((HVar2.d != (Data *)0x0) || (uVar3 != 0));
LAB_00349ec4:
  QHash<QString,_QHashDummyValue>::clear(&s_pixmapCacheKeys.q_hash);
  return;
}

Assistant:

inline iterator begin() { if (!d) return iterator(); detach(); return iterator(d->begin()); }